

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namingConventions.cpp
# Opt level: O2

void namingConventions::adjustForAllFiles
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *inputFiles,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *oldNames,vector<Pda_*,_std::allocator<Pda_*>_> *pdas,bool forClass)

{
  pointer pbVar1;
  pointer ppPVar2;
  Pda *this;
  bool bVar3;
  pointer pbVar4;
  istream *piVar5;
  uint uVar6;
  ulong uVar7;
  string *psVar8;
  string word;
  string longestFit;
  string editedstring;
  string line;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  ofstream editedFile;
  fstream buffer;
  
  pbVar1 = (inputFiles->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar4 = (inputFiles->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    std::fstream::fstream(&buffer,(pbVar4->_M_dataplus)._M_p,_S_out|_S_in);
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    editedstring._M_dataplus._M_p = (pointer)&editedstring.field_2;
    editedstring._M_string_length = 0;
    editedstring.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&buffer,(string *)&line);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&editedFile,(string *)&line,_S_out|_S_in);
      word._M_dataplus._M_p = (pointer)&word.field_2;
      word._M_string_length = 0;
      word.field_2._M_local_buf[0] = '\0';
      while( true ) {
        piVar5 = std::operator>>((istream *)&editedFile,(string *)&word);
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
        longestFit._M_dataplus._M_p = (pointer)&longestFit.field_2;
        longestFit._M_string_length = 0;
        longestFit.field_2._M_local_buf[0] = '\0';
        uVar6 = 0;
        while( true ) {
          uVar7 = (ulong)uVar6;
          ppPVar2 = (pdas->super__Vector_base<Pda_*,_std::allocator<Pda_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          if ((ulong)((long)(pdas->super__Vector_base<Pda_*,_std::allocator<Pda_*>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppPVar2 >> 3) <= uVar7) break;
          this = ppPVar2[uVar7];
          std::__cxx11::string::string((string *)&local_460,(string *)&word);
          bVar3 = Pda::traverse(this,&local_460);
          std::__cxx11::string::~string((string *)&local_460);
          if (bVar3) {
            if (forClass) {
              psVar8 = (oldNames->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar7;
              std::__cxx11::string::string((string *)&local_4a0,(string *)psVar8);
              correctClassName(&local_480,&local_4a0);
              editToNewName(&local_4e0,&word,psVar8,&local_480);
              std::__cxx11::string::operator=((string *)&word,(string *)&local_4e0);
              std::__cxx11::string::~string((string *)&local_4e0);
              std::__cxx11::string::~string((string *)&local_480);
              psVar8 = &local_4a0;
            }
            else {
              psVar8 = (oldNames->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + uVar7;
              std::__cxx11::string::string((string *)&local_4c0,(string *)psVar8);
              correctName(&local_480,&local_4c0);
              editToNewName(&local_4e0,&word,psVar8,&local_480);
              std::__cxx11::string::operator=((string *)&word,(string *)&local_4e0);
              std::__cxx11::string::~string((string *)&local_4e0);
              std::__cxx11::string::~string((string *)&local_480);
              psVar8 = &local_4c0;
            }
            std::__cxx11::string::~string((string *)psVar8);
            if (longestFit._M_string_length < word._M_string_length) {
              std::__cxx11::string::_M_assign((string *)&longestFit);
            }
          }
          uVar6 = uVar6 + 1;
        }
        if (longestFit._M_string_length == 0) {
          std::operator+(&local_4e0,&word,' ');
          std::__cxx11::string::append((string *)&editedstring);
        }
        else {
          std::operator+(&local_4e0,&longestFit,' ');
          std::__cxx11::string::append((string *)&editedstring);
        }
        std::__cxx11::string::~string((string *)&local_4e0);
        std::__cxx11::string::~string((string *)&longestFit);
      }
      std::__cxx11::string::append((char *)&editedstring);
      std::__cxx11::string::~string((string *)&word);
      std::__cxx11::stringstream::~stringstream((stringstream *)&editedFile);
    }
    std::fstream::close();
    std::ofstream::ofstream((stringstream *)&editedFile);
    std::ofstream::open((string *)&editedFile,(_Ios_Openmode)pbVar4);
    std::operator<<((ostream *)&editedFile,(string *)&editedstring);
    std::ofstream::close();
    std::ofstream::~ofstream((stringstream *)&editedFile);
    std::__cxx11::string::~string((string *)&editedstring);
    std::__cxx11::string::~string((string *)&line);
    std::fstream::~fstream(&buffer);
  }
  return;
}

Assistant:

void
namingConventions::adjustForAllFiles(const std::vector<std::string> &inputFiles, std::vector<std::string> &oldNames,
                                     std::vector<Pda *> &pdas, bool forClass) {
    for (auto &file:inputFiles) {
        std::fstream buffer(file.c_str());
        std::string line;
        std::string editedstring;

        // loop over alle lines
        while (std::getline(buffer, line)) {
            std::stringstream stream(line);
            std::string word;
            // loop over elk woord op een line
            while (stream >> word) {
                // zoekt de juiste classname aan de hand van pda's, past word correct aan
                std::string longestFit;
                for (unsigned int i = 0; i < pdas.size(); ++i) {
                    Pda *tester = pdas[i];
                    if (tester->traverse(word)) {
                        if (forClass) {
                            word = editToNewName(word, oldNames[i], namingConventions::correctClassName(oldNames[i]));

                        } else {
                            word = editToNewName(word, oldNames[i], correctName(oldNames[i]));
                        }
                        if (word.size() > longestFit.size()) {
                            longestFit = word;
                        }

                    }
                }
                if (!longestFit.empty()) {
                    editedstring += longestFit + ' ';
                } else {
                    editedstring += word + ' ';
                }
            }
            editedstring += "\n";

        }
            // schrijft string naar file
            buffer.close();
            std::ofstream editedFile;
            editedFile.open(file, std::ofstream::out | std::ofstream::trunc);
            editedFile << editedstring;
            editedFile.close();

    }
}